

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# information_flow.c
# Opt level: O0

void accumulate_observations
               (int *src,int *dst,int *back,size_t l,size_t n,size_t m,int b,size_t k,
               inform_dist *states,inform_dist *histories,inform_dist *sources,
               inform_dist *predicates)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong local_78;
  size_t u;
  size_t j_1;
  size_t j;
  int q;
  int history;
  int back_state;
  int predicate;
  int source;
  int state;
  int future;
  int src_state;
  size_t i;
  size_t m_local;
  size_t n_local;
  size_t l_local;
  int *back_local;
  int *dst_local;
  int *src_local;
  
  back_local = dst;
  dst_local = src;
  for (_future = 0; _future < n; _future = _future + 1) {
    j._4_4_ = 0;
    j._0_4_ = 1;
    for (j_1 = 0; j_1 < k; j_1 = j_1 + 1) {
      j._0_4_ = b * (int)j;
      j._4_4_ = back_local[j_1] + b * j._4_4_;
    }
    for (u = k; u < m; u = u + 1) {
      q = 0;
      for (local_78 = 0; local_78 < l; local_78 = local_78 + 1) {
        q = b * q + back[u + m * (_future + n * local_78) + -1];
      }
      iVar1 = q * (int)j + j._4_4_;
      iVar2 = iVar1 * b + dst_local[u - 1];
      iVar3 = iVar1 * b + back_local[u];
      iVar4 = iVar3 * b + dst_local[u - 1];
      states->histogram[iVar4] = states->histogram[iVar4] + 1;
      histories->histogram[iVar1] = histories->histogram[iVar1] + 1;
      sources->histogram[iVar2] = sources->histogram[iVar2] + 1;
      predicates->histogram[iVar3] = predicates->histogram[iVar3] + 1;
      j._4_4_ = iVar3 - (back_local[u - k] + q * b) * (int)j;
    }
    dst_local = dst_local + m;
    back_local = back_local + m;
  }
  return;
}

Assistant:

static void accumulate_observations(int const *src, int const *dst,
    int const *back, size_t l_src, size_t l_dst, size_t l_back,
    size_t n, size_t m, int b, inform_dist *joint, inform_dist *as,
    inform_dist *bs, inform_dist *s)
{
    int const qs = s->size, qbs = bs->size;
    for (size_t i = 0; i < n; ++i)
    {
        for (size_t j = 0; j < m; ++j)
        {
            int a_state = 0, b_state = 0, s_state = 0;
            for (size_t k = 0; k < l_src; ++k)
            {
                a_state *= b;
                a_state += src[j + i * m + k * n * m];
            }
            for (size_t k = 0; k < l_dst; ++k)
            {
                b_state *= b;
                b_state += dst[j + i * m + k * n * m];
            }
            for (size_t k = 0; k < l_back; ++k)
            {
                s_state *= b;
                s_state += back[j + i * m + k * n * m];
            }

            int as_state = a_state * qs + s_state;
            int bs_state = b_state * qs + s_state;
            int joint_state = a_state * qbs + bs_state;

            joint->histogram[joint_state]++;
            as->histogram[as_state]++;
            bs->histogram[bs_state]++;
            s->histogram[s_state]++;
        }
    }
}